

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O2

void __thiscall
Assimp::LWO::AnimResolver::ExtractAnimChannel(AnimResolver *this,aiNodeAnim **out,uint flags)

{
  undefined8 *puVar1;
  Envelope *pEVar2;
  pointer paVar3;
  pointer paVar4;
  aiNodeAnim *paVar5;
  ulong uVar6;
  aiVectorKey *paVar7;
  aiQuatKey *paVar8;
  long lVar9;
  aiQuatKey *paVar10;
  ulong uVar11;
  size_t sVar12;
  uint i;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  aiQuaterniont<float> aVar16;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> keys;
  aiQuaterniont<float> local_70;
  aiQuaterniont<float> local_60;
  aiQuaterniont<float> local_50;
  aiQuaterniont<float> local_40;
  
  *out = (aiNodeAnim *)0x0;
  if ((((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
       &((_List_node_base *)this->envelopes)->_M_next)->_M_impl)._M_node.super__List_node_base.
      _M_next != (_List_node_base *)this->envelopes) {
    pEVar2 = this->trans_x;
    if (((pEVar2 == (Envelope *)0x0) ||
        (bVar13 = true,
        (ulong)(((long)(pEVar2->keys).
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(pEVar2->keys).
                      super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x28) < 2)) &&
       ((pEVar2 = this->trans_y, pEVar2 == (Envelope *)0x0 ||
        (bVar13 = true,
        (ulong)(((long)(pEVar2->keys).
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(pEVar2->keys).
                      super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x28) < 2)))) {
      pEVar2 = this->trans_z;
      if (pEVar2 == (Envelope *)0x0) {
        bVar13 = false;
      }
      else {
        bVar13 = 1 < (ulong)(((long)(pEVar2->keys).
                                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pEVar2->keys).
                                   super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x28);
      }
    }
    pEVar2 = this->rotat_x;
    if (((pEVar2 == (Envelope *)0x0) ||
        (bVar14 = true,
        (ulong)(((long)(pEVar2->keys).
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(pEVar2->keys).
                      super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x28) < 2)) &&
       ((pEVar2 = this->rotat_y, pEVar2 == (Envelope *)0x0 ||
        (bVar14 = true,
        (ulong)(((long)(pEVar2->keys).
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(pEVar2->keys).
                      super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x28) < 2)))) {
      pEVar2 = this->rotat_z;
      if (pEVar2 == (Envelope *)0x0) {
        bVar14 = false;
      }
      else {
        bVar14 = 1 < (ulong)(((long)(pEVar2->keys).
                                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pEVar2->keys).
                                   super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x28);
      }
    }
    pEVar2 = this->scale_x;
    if (((pEVar2 == (Envelope *)0x0) ||
        (bVar15 = true,
        (ulong)(((long)(pEVar2->keys).
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(pEVar2->keys).
                      super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x28) < 2)) &&
       ((pEVar2 = this->scale_y, pEVar2 == (Envelope *)0x0 ||
        (bVar15 = true,
        (ulong)(((long)(pEVar2->keys).
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(pEVar2->keys).
                      super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x28) < 2)))) {
      pEVar2 = this->scale_z;
      if (pEVar2 == (Envelope *)0x0) {
        bVar15 = false;
      }
      else {
        bVar15 = 1 < (ulong)(((long)(pEVar2->keys).
                                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pEVar2->keys).
                                   super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x28);
      }
      if ((!bVar13 && !bVar14) && (!bVar15)) {
        return;
      }
    }
    paVar5 = (aiNodeAnim *)operator_new(0x438);
    (paVar5->mNodeName).length = 0;
    (paVar5->mNodeName).data[0] = '\0';
    memset((paVar5->mNodeName).data + 1,0x1b,0x3ff);
    paVar5->mRotationKeys = (aiQuatKey *)0x0;
    paVar5->mNumScalingKeys = 0;
    *(undefined8 *)&paVar5->mNumPositionKeys = 0;
    *(undefined8 *)((long)&paVar5->mPositionKeys + 4) = 0;
    paVar5->mScalingKeys = (aiVectorKey *)0x0;
    paVar5->mPreState = aiAnimBehaviour_DEFAULT;
    paVar5->mPostState = aiAnimBehaviour_DEFAULT;
    *out = paVar5;
    if (this->need_to_setup == true) {
      UpdateAnimRangeSetup(this);
      this->need_to_setup = false;
    }
    if (bVar13) {
      keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      GetKeys(this,&keys,this->trans_x,this->trans_y,this->trans_z,flags);
      paVar4 = keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
               super__Vector_impl_data._M_finish;
      paVar3 = keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar12 = (long)keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar6 = (long)sVar12 / 0x18;
      paVar5->mNumPositionKeys = (uint)uVar6;
      uVar6 = uVar6 & 0xffffffff;
      uVar11 = uVar6 * 0x18;
      paVar7 = (aiVectorKey *)operator_new__(uVar11);
      if (uVar6 != 0) {
        lVar9 = 0;
        do {
          *(undefined4 *)((long)&(paVar7->mValue).z + lVar9) = 0;
          puVar1 = (undefined8 *)((long)&paVar7->mTime + lVar9);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar9 = lVar9 + 0x18;
        } while (uVar11 - lVar9 != 0);
      }
      paVar5->mPositionKeys = paVar7;
      if (paVar4 != paVar3) {
        memmove(paVar7,paVar3,sVar12);
      }
      std::_Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>::~_Vector_base
                (&keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>);
    }
    if (bVar14) {
      keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      GetKeys(this,&keys,this->rotat_x,this->rotat_y,this->rotat_z,flags);
      uVar6 = ((long)keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x18;
      paVar5->mNumRotationKeys = (uint)uVar6;
      uVar11 = uVar6 & 0xffffffff;
      paVar8 = (aiQuatKey *)operator_new__(uVar11 * 0x18);
      if (uVar11 != 0) {
        paVar10 = paVar8;
        do {
          paVar10->mTime = 0.0;
          (paVar10->mValue).w = 1.0;
          (paVar10->mValue).x = 0.0;
          (paVar10->mValue).y = 0.0;
          (paVar10->mValue).z = 0.0;
          paVar10 = paVar10 + 1;
        } while (paVar10 != paVar8 + uVar11);
      }
      paVar5->mRotationKeys = paVar8;
      lVar9 = 0;
      for (uVar11 = 0; uVar11 < (uVar6 & 0xffffffff); uVar11 = uVar11 + 1) {
        paVar8 = paVar5->mRotationKeys;
        *(undefined8 *)((long)&paVar8->mTime + lVar9) =
             *(undefined8 *)
              ((long)&(keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                       super__Vector_impl_data._M_start)->mTime + lVar9);
        aiQuaterniont<float>::aiQuaterniont
                  (&local_40,(aiVector3t<float>)ZEXT812(0x3f80000000000000),
                   *(float *)((long)&((keys.
                                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->mValue).x + lVar9
                             ));
        aiQuaterniont<float>::aiQuaterniont
                  (&local_50,(aiVector3t<float>)ZEXT812(0x3f800000),
                   *(float *)((long)&((keys.
                                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->mValue).y + lVar9
                             ));
        local_70 = aiQuaterniont<float>::operator*(&local_40,&local_50);
        aiQuaterniont<float>::aiQuaterniont
                  (&local_60,(aiVector3t<float>)(ZEXT412(0x3f800000) << 0x40),
                   *(float *)((long)&((keys.
                                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->mValue).z + lVar9
                             ));
        aVar16 = aiQuaterniont<float>::operator*(&local_70,&local_60);
        *(aiQuaterniont<float> *)((long)&(paVar8->mValue).w + lVar9) = aVar16;
        uVar6 = (ulong)paVar5->mNumRotationKeys;
        lVar9 = lVar9 + 0x18;
      }
      std::_Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>::~_Vector_base
                (&keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>);
    }
    if (bVar15) {
      keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      GetKeys(this,&keys,this->scale_x,this->scale_y,this->scale_z,flags);
      paVar4 = keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
               super__Vector_impl_data._M_finish;
      paVar3 = keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar12 = (long)keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar6 = (long)sVar12 / 0x18;
      paVar5->mNumScalingKeys = (uint)uVar6;
      uVar6 = uVar6 & 0xffffffff;
      uVar11 = uVar6 * 0x18;
      paVar7 = (aiVectorKey *)operator_new__(uVar11);
      if (uVar6 != 0) {
        lVar9 = 0;
        do {
          *(undefined4 *)((long)&(paVar7->mValue).z + lVar9) = 0;
          puVar1 = (undefined8 *)((long)&paVar7->mTime + lVar9);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar9 = lVar9 + 0x18;
        } while (uVar11 - lVar9 != 0);
      }
      paVar5->mScalingKeys = paVar7;
      if (paVar4 != paVar3) {
        memmove(paVar7,paVar3,sVar12);
      }
      std::_Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>::~_Vector_base
                (&keys.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>);
    }
  }
  return;
}

Assistant:

void AnimResolver::ExtractAnimChannel(aiNodeAnim** out, unsigned int flags /*= 0*/)
{
    *out = NULL;


    //FIXME: crashes if more than one component is animated at different timings, to be resolved.

    // If we have no envelopes, return NULL
    if (envelopes.empty()) {
        return;
    }

    // We won't spawn an animation channel if we don't have at least one envelope with more than one keyframe defined.
    const bool trans = ((trans_x && trans_x->keys.size() > 1) || (trans_y && trans_y->keys.size() > 1) || (trans_z && trans_z->keys.size() > 1));
    const bool rotat = ((rotat_x && rotat_x->keys.size() > 1) || (rotat_y && rotat_y->keys.size() > 1) || (rotat_z && rotat_z->keys.size() > 1));
    const bool scale = ((scale_x && scale_x->keys.size() > 1) || (scale_y && scale_y->keys.size() > 1) || (scale_z && scale_z->keys.size() > 1));
    if (!trans && !rotat && !scale)
        return;

    // Allocate the output animation
    aiNodeAnim* anim = *out = new aiNodeAnim();

    // Setup default animation setup if necessary
    if (need_to_setup) {
        UpdateAnimRangeSetup();
        need_to_setup = false;
    }

    // copy translation keys
    if (trans) {
        std::vector<aiVectorKey> keys;
        GetKeys(keys,trans_x,trans_y,trans_z,flags);

        anim->mPositionKeys = new aiVectorKey[ anim->mNumPositionKeys = static_cast<unsigned int>(keys.size()) ];
        std::copy(keys.begin(),keys.end(),anim->mPositionKeys);
    }

    // copy rotation keys
    if (rotat) {
        std::vector<aiVectorKey> keys;
        GetKeys(keys,rotat_x,rotat_y,rotat_z,flags);

        anim->mRotationKeys = new aiQuatKey[ anim->mNumRotationKeys = static_cast<unsigned int>(keys.size()) ];

        // convert heading, pitch, bank to quaternion
        // mValue.x=Heading=Rot(Y), mValue.y=Pitch=Rot(X), mValue.z=Bank=Rot(Z)
        // Lightwave's rotation order is ZXY
        aiVector3D X(1.0,0.0,0.0);
        aiVector3D Y(0.0,1.0,0.0);
        aiVector3D Z(0.0,0.0,1.0);
        for (unsigned int i = 0; i < anim->mNumRotationKeys; ++i) {
            aiQuatKey& qk = anim->mRotationKeys[i];
            qk.mTime  = keys[i].mTime;
            qk.mValue = aiQuaternion(Y,keys[i].mValue.x)*aiQuaternion(X,keys[i].mValue.y)*aiQuaternion(Z,keys[i].mValue.z);
        }
    }

    // copy scaling keys
    if (scale) {
        std::vector<aiVectorKey> keys;
        GetKeys(keys,scale_x,scale_y,scale_z,flags);

        anim->mScalingKeys = new aiVectorKey[ anim->mNumScalingKeys = static_cast<unsigned int>(keys.size()) ];
        std::copy(keys.begin(),keys.end(),anim->mScalingKeys);
    }
}